

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgramCache.cpp
# Opt level: O1

bool __thiscall
Diligent::GLProgramCache::ProgramCacheKey::operator==(ProgramCacheKey *this,ProgramCacheKey *Key)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  size_t __n;
  
  if ((this->Hash == Key->Hash) && (this->IsSeparableProgram == Key->IsSeparableProgram)) {
    piVar1 = (this->ShaderUIDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->ShaderUIDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)piVar2 - (long)piVar1;
    piVar3 = (Key->ShaderUIDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((__n == (long)(Key->ShaderUIDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar3) &&
       ((piVar2 == piVar1 || (iVar5 = bcmp(piVar1,piVar3,__n), iVar5 == 0)))) {
      piVar1 = (this->SignaturUIDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (this->SignaturUIDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar3 = (Key->SignaturUIDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((long)piVar2 - (long)piVar1 ==
           (long)(Key->SignaturUIDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar3) &&
         ((piVar2 == piVar1 || (iVar5 = bcmp(piVar1,piVar3,(long)piVar2 - (long)piVar1), iVar5 == 0)
          ))) {
        if (piVar1 != piVar2) {
          return true;
        }
        bVar4 = PipelineResourceLayoutDesc::IsEqual
                          (&(this->ResourceLayout).super_PipelineResourceLayoutDesc,
                           &(Key->ResourceLayout).super_PipelineResourceLayoutDesc,false,false);
        return bVar4;
      }
    }
  }
  return false;
}

Assistant:

bool GLProgramCache::ProgramCacheKey::operator==(const ProgramCacheKey& Key) const noexcept
{
    // clang-format off
    return (Hash               == Key.Hash               &&
            IsSeparableProgram == Key.IsSeparableProgram &&
            ShaderUIDs         == Key.ShaderUIDs         &&
            SignaturUIDs       == Key.SignaturUIDs       &&
            (!SignaturUIDs.empty() || ResourceLayout == Key.ResourceLayout));
    // clang-format on
}